

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorting.c
# Opt level: O2

int main(void)

{
  Vector *pVVar1;
  long lVar2;
  int v [6];
  
  v[0] = 0x48;
  v[1] = 0x1d;
  v[2] = 0x26;
  v[3] = 0x16;
  v[4] = 0x3c;
  v[5] = 2;
  puts("Hello! Let\'s sort this out!");
  for (lVar2 = 0; lVar2 != 0x78; lVar2 = lVar2 + 0x18) {
    printf("\nRunning %s\n",*(undefined8 *)((long)&PTR_anon_var_dwarf_62_00103d90 + lVar2));
    pVVar1 = Vector_createFromArrayCopy(v,6);
    puts("Initial Array:");
    Vector_print(pVVar1);
    (**(code **)((long)&PTR_Sort_Selection_Vector_00103d80 + lVar2))(pVVar1);
    puts("Sorted Array:");
    Vector_print(pVVar1);
    Vector_destroy(pVVar1);
  }
  printf("\nLet\'s sort just part of the vector, from index %1d to %1d\n",1,4);
  for (lVar2 = 0; lVar2 != 0x78; lVar2 = lVar2 + 0x18) {
    printf("\nRunning %s\n",*(undefined8 *)((long)&PTR_anon_var_dwarf_62_00103d90 + lVar2));
    pVVar1 = Vector_createFromArrayCopy(v,6);
    puts("Initial Array:");
    Vector_print(pVVar1);
    (**(code **)((long)&PTR_Sort_Selection_Vector_Range_00103d88 + lVar2))(pVVar1,1,4);
    puts("Sorted Array:");
    Vector_print(pVVar1);
    Vector_destroy(pVVar1);
  }
  puts("\nRunning Insertion sort using Void function");
  pVVar1 = Vector_createFromArrayCopy(v,6);
  puts("Initial Array:");
  Vector_print(pVVar1);
  Sort_Insertion_Range(pVVar1->a,0,5,4,lessFunc,print);
  puts("Sorted Array:");
  Vector_print(pVVar1);
  Vector_destroy(pVVar1);
  return 0;
}

Assistant:

int main() {
#if OS_WIN
    int input = 0;
#endif
    int v[] = {72, 29, 38, 22, 60, 2};

    SortFunctionPair functions[] = {
            {Sort_Selection_Vector, Sort_Selection_Vector_Range, "Selection Sort"},
            {Sort_Insertion_Vector, Sort_Insertion_Vector_Range, "Insertion Sort"},
            {Sort_Bubble_Vector,    Sort_Bubble_Vector_Range,    "Bubble Sort"},
            {Sort_Heap_Vector,      Sort_Heap_Vector_Range,      "Heap Sort"},
            {Sort_Quick_Vector,     Sort_Quick_Vector_Range,     "Quick Sort"}
    };
    int functionsSize = 5;
    int i;
    Vector* vector;
    unsigned int min = 1, max = 4;

    printf("Hello! Let's sort this out!\n");

    for (i = 0; i < functionsSize; ++i) {
        printf("\nRunning %s\n", functions[i].name);
        vector = Vector_createFromArrayCopy(v, 6);

        printf("Initial Array:\n");
        Vector_print(vector);

        (*functions[i].sortFunction)(vector);

        printf("Sorted Array:\n");
        Vector_print(vector);

        Vector_destroy(vector);
    }

    printf("\nLet's sort just part of the vector, from index %1d to %1d\n", min,
           max);

    for (i = 0; i < functionsSize; ++i) {
        printf("\nRunning %s\n", functions[i].name);
        vector = Vector_createFromArrayCopy(v, 6);

        printf("Initial Array:\n");
        Vector_print(vector);

        (*functions[i].sortRangeFunction)(vector, min, max);

        printf("Sorted Array:\n");
        Vector_print(vector);

        Vector_destroy(vector);
    }

    printf("\nRunning Insertion sort using Void function\n");
    vector = Vector_createFromArrayCopy(v, 6);

    printf("Initial Array:\n");
    Vector_print(vector);

    Sort_Insertion_Range((void*) vector->a, 0, 5, sizeof(Number), lessFunc,
                         print);

    printf("Sorted Array:\n");
    Vector_print(vector);

    Vector_destroy(vector);

#if DEBUG
    printf("Debug Flag is active!\n");
#endif

#if OS_WIN
    scanf("%d", &input);
#endif

    return 0;
}